

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# display.cpp
# Opt level: O2

tuple<int,_int,_int> __thiscall
Display::getMaximumFieldsize(Display *this,int window_width,int window_height,int mine_count)

{
  int iVar1;
  bool bVar2;
  int iVar3;
  runtime_error *this_00;
  _Head_base<0UL,_int,_false> extraout_EDX;
  uint uVar4;
  int field_height;
  int iVar5;
  double dVar6;
  tuple<int,_int,_int> tVar7;
  undefined1 local_190 [64];
  string local_150;
  string local_130;
  string local_110;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  bVar2 = isWindowSizeSufficient(1,1,mine_count,window_width,window_height);
  if (bVar2) {
    field_height = -1;
    do {
      bVar2 = isWindowSizeSufficient(1,field_height + 2,mine_count,window_width,window_height);
      field_height = field_height + 1;
      iVar3 = 1;
    } while (bVar2);
    do {
      iVar5 = iVar3;
      bVar2 = isWindowSizeSufficient(iVar5,field_height,mine_count,window_width,window_height);
      iVar3 = iVar5 + 1;
    } while (bVar2);
    iVar5 = iVar5 + -1;
    iVar3 = iVar5 * field_height;
    uVar4 = 0;
    while( true ) {
      bVar2 = isWindowSizeSufficient(iVar5,field_height,mine_count,window_width,window_height);
      if (((!bVar2) || (iVar3 < mine_count)) || (8 < uVar4)) break;
      uVar4 = uVar4 + 1;
      dVar6 = pow(10.0,(double)(int)uVar4);
      mine_count = (int)dVar6;
    }
    iVar1 = mine_count + -1;
    if (iVar3 <= mine_count + -1) {
      iVar1 = iVar3;
    }
    *(int *)&(this->controller).mfield.mines.
             super__Vector_base<std::vector<bool,_std::allocator<bool>_>,_std::allocator<std::vector<bool,_std::allocator<bool>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start = iVar1;
    *(int *)((long)&(this->controller).mfield.mines.
                    super__Vector_base<std::vector<bool,_std::allocator<bool>_>,_std::allocator<std::vector<bool,_std::allocator<bool>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start + 4) = field_height;
    *(int *)&(this->controller).mfield.mines.
             super__Vector_base<std::vector<bool,_std::allocator<bool>_>,_std::allocator<std::vector<bool,_std::allocator<bool>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish = iVar5;
    tVar7.super__Tuple_impl<0UL,_int,_int,_int>.super__Head_base<0UL,_int,_false>._M_head_impl =
         extraout_EDX._M_head_impl;
    tVar7.super__Tuple_impl<0UL,_int,_int,_int>.super__Tuple_impl<1UL,_int,_int> =
         (_Tuple_impl<1UL,_int,_int>)this;
    return (tuple<int,_int,_int>)tVar7.super__Tuple_impl<0UL,_int,_int,_int>;
  }
  getRequiredWindowSize((Display *)local_190,1,1,mine_count);
  this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
  std::__cxx11::to_string(&local_110,window_width);
  std::operator+(&local_f0,"Can\'t display any minefield on this size (",&local_110);
  std::operator+(&local_d0,&local_f0,"x");
  std::__cxx11::to_string(&local_130,window_height);
  std::operator+(&local_b0,&local_d0,&local_130);
  std::operator+(&local_90,&local_b0,"), minimum required: ");
  std::__cxx11::to_string(&local_150,local_190._4_4_);
  std::operator+(&local_70,&local_90,&local_150);
  std::operator+(&local_50,&local_70,"x");
  std::__cxx11::to_string((string *)(local_190 + 0x20),local_190._0_4_);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_190,
                 &local_50,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 (local_190 + 0x20));
  std::runtime_error::runtime_error(this_00,(string *)local_190);
  __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

std::tuple<int, int, int> Display::getMaximumFieldsize(int window_width, int window_height, int mine_count) {
    int width = 1;
    int height = 1;
    int count = mine_count;

    if (! isWindowSizeSufficient(width, height, count, window_width, window_height)) {
        int required_width, required_height;
        std::tie(required_width, required_height) = Display::getRequiredWindowSize(width, height, count);
        throw std::runtime_error("Can't display any minefield on this size (" + std::to_string(window_width) + "x" + std::to_string(window_height) + "), minimum required: " + std::to_string(required_width) + "x" + std::to_string(required_height));
    }

    // get max y
    while (isWindowSizeSufficient(width, height, count, window_width, window_height)) {
        height++;
    }
    // height is now one too much
    height--;

    // get max x
    while (isWindowSizeSufficient(width, height, count, window_width, window_height)) {
        width++;
    }
    // width is now one too much
    width--;

    // now get max. minecount
    
    int exponent = 0;
    while (isWindowSizeSufficient(width, height, count, window_width, window_height) && count <= width * height) {
        exponent++;
        if (std::numeric_limits<int>::digits10 < exponent) {
            break;
        }
        count = std::pow(10, exponent);
    }
    // remove one decimal digit -> is OK
    count--;
    if (count > width * height) {
        count = width * height;
    }

    return std::make_tuple(width, height, count);
}